

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkShapes.cpp
# Opt level: O2

void __thiscall
CoreML::NeuralNetworkShaper::shapeSplitLayer
          (NeuralNetworkShaper *this,NeuralNetworkLayer *specLayer)

{
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  uint64 uVar1;
  Type *pTVar2;
  mapped_type *this_01;
  SplitLayerParams *pSVar3;
  mapped_type *pmVar4;
  ShapeRange *pSVar5;
  int val;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
  *this_02;
  int i;
  int index;
  ShapeRange local_50;
  
  this_02 = &this->blobShapes;
  pTVar2 = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                     (&(specLayer->input_).super_RepeatedPtrFieldBase,0);
  this_01 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
            ::operator[](this_02,pTVar2);
  pSVar3 = Specification::NeuralNetworkLayer::split(specLayer);
  uVar1 = pSVar3->noutputs_;
  this_00 = &specLayer->output_;
  for (index = 0; val = (int)uVar1,
      index < (specLayer->output_).super_RepeatedPtrFieldBase.current_size_; index = index + 1) {
    pTVar2 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                       (&this_00->super_RepeatedPtrFieldBase,index);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
             ::operator[](this_02,pTVar2);
    pTVar2 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                       (&this_00->super_RepeatedPtrFieldBase,index);
    ShapeConstraint::setName(pmVar4,pTVar2);
    pSVar5 = ShapeConstraint::sequenceRange(this_01);
    ShapeConstraint::updateSequenceRange(pmVar4,pSVar5);
    pSVar5 = ShapeConstraint::batchRange(this_01);
    ShapeConstraint::updateBatchRange(pmVar4,pSVar5);
    pSVar5 = ShapeConstraint::channelRange(this_01);
    ShapeRange::operator/(&local_50,pSVar5,val);
    ShapeConstraint::updateChannelRange(pmVar4,&local_50);
    pSVar5 = ShapeConstraint::heightRange(this_01);
    ShapeConstraint::updateHeightRange(pmVar4,pSVar5);
    pSVar5 = ShapeConstraint::widthRange(this_01);
    ShapeConstraint::updateWidthRange(pmVar4,pSVar5);
  }
  pTVar2 = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                     (&this_00->super_RepeatedPtrFieldBase,0);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
           ::operator[](this_02,pTVar2);
  pSVar5 = ShapeConstraint::sequenceRange(pmVar4);
  ShapeConstraint::updateSequenceRange(this_01,pSVar5);
  pSVar5 = ShapeConstraint::batchRange(pmVar4);
  ShapeConstraint::updateBatchRange(this_01,pSVar5);
  pSVar5 = ShapeConstraint::channelRange(pmVar4);
  ShapeRange::operator*(&local_50,pSVar5,(long)val);
  ShapeConstraint::updateChannelRange(this_01,&local_50);
  pSVar5 = ShapeConstraint::heightRange(pmVar4);
  ShapeConstraint::updateHeightRange(this_01,pSVar5);
  pSVar5 = ShapeConstraint::widthRange(pmVar4);
  ShapeConstraint::updateWidthRange(this_01,pSVar5);
  return;
}

Assistant:

void NeuralNetworkShaper::shapeSplitLayer(const Specification::NeuralNetworkLayer& specLayer) {

    ShapeConstraint& inputShape = blobShapes[specLayer.input(0)];

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Split layer " << specLayer.name() << " input shapes (before): " << std::endl;
    std::cout << inputShape;
    std::cout << "Split layer " << specLayer.name() << " output shapes (before): " << std::endl;
    for (int i = 0; i < specLayer.output_size(); i++) {
        ShapeConstraint& outputShape = blobShapes[specLayer.output(i)];
        outputShape.setName(specLayer.output(i));
        std::cout << outputShape;
    }
#endif

    int nout = static_cast<int>(specLayer.split().noutputs());

    for (int i = 0; i < specLayer.output_size(); i++) {

        ShapeConstraint& outputShape = blobShapes[specLayer.output(i)];
        outputShape.setName(specLayer.output(i));

        outputShape.updateSequenceRange(inputShape.sequenceRange());
        outputShape.updateBatchRange(inputShape.batchRange());
        outputShape.updateChannelRange(inputShape.channelRange() / nout);
        outputShape.updateHeightRange(inputShape.heightRange());
        outputShape.updateWidthRange(inputShape.widthRange());

    }
    
    ShapeConstraint& outputShape = blobShapes[specLayer.output(0)];
    inputShape.updateSequenceRange(outputShape.sequenceRange());
    inputShape.updateBatchRange(outputShape.batchRange());
    inputShape.updateChannelRange(outputShape.channelRange() * static_cast<size_t>(nout));
    inputShape.updateHeightRange(outputShape.heightRange());
    inputShape.updateWidthRange(outputShape.widthRange());

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Split layer " << specLayer.name() << " input shapes (after): " << std::endl;
    std::cout << inputShape;
    std::cout << "Split layer " << specLayer.name() << " output shapes (after): " << std::endl;
    for (int i = 0; i < specLayer.output_size(); i++) {
        ShapeConstraint& outputShape = blobShapes[specLayer.output(i)];
        outputShape.setName(specLayer.output(i));
        std::cout << outputShape;
    }
#endif


}